

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

void __thiscall Triangle_Reintersect_Test::TestBody(Triangle_Reintersect_Test *this)

{
  AssertHelper *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Triangle *pTVar5;
  Float *pFVar6;
  ShapeSample *this_00;
  ShapeIntersection *pSVar7;
  Point3f *pPVar8;
  char *in_R9;
  int j;
  int iVar9;
  int iVar10;
  Float FVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  Point3f PVar17;
  Vector3f VVar18;
  AssertionResult gtest_ar__1;
  AssertHelper local_390;
  ShapeHandle tri;
  Float local_37c;
  undefined1 local_378 [8];
  undefined1 local_370 [16];
  Point2f u;
  Float local_358 [3];
  float local_34c;
  float local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  Ray local_338;
  Ray local_310;
  uint64_t local_2e8;
  Tuple3<pbrt::Vector3,_float> local_2e0;
  _Any_data local_2d0;
  code *local_2c0;
  code *local_2b8;
  AssertionResult gtest_ar_;
  bool local_1b0;
  optional<pbrt::ShapeSample> ts;
  RNG rng;
  optional<pbrt::ShapeIntersection> si;
  undefined1 extraout_var [60];
  undefined1 auVar16 [56];
  
  local_2e8 = 0;
  do {
    if (local_2e8 == 1000) {
      return;
    }
    pbrt::RNG::SetSequence(&rng,local_2e8);
    local_2d0._8_8_ = 0;
    local_2b8 = std::
                _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                ::_M_invoke;
    local_2c0 = std::
                _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                ::_M_manager;
    local_2d0._M_unused._M_object = &rng;
    pTVar5 = GetRandomTriangle((function<float_()> *)&local_2d0);
    tri.
    super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
    .bits = (TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
             )((ulong)pTVar5 | 0x4000000000000);
    std::_Function_base::~_Function_base((_Function_base *)&local_2d0);
    if (((ulong)tri.
                super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                .bits & 0xffffffffffff) != 0) {
      local_348 = pbrt::RNG::Uniform<float>(&rng);
      uStack_344 = extraout_XMM0_Db;
      uStack_340 = extraout_XMM0_Dc;
      uStack_33c = extraout_XMM0_Dd;
      auVar13._0_4_ = pbrt::RNG::Uniform<float>(&rng);
      auVar13._4_60_ = extraout_var;
      auVar2._4_4_ = uStack_344;
      auVar2._0_4_ = local_348;
      auVar2._8_4_ = uStack_340;
      auVar2._12_4_ = uStack_33c;
      auVar2 = vinsertps_avx(auVar2,auVar13._0_16_,0x10);
      pbrt::ShapeHandle::Sample(&ts,&tri,(Point2f)auVar2._0_8_);
      gtest_ar_.success_ = ts.set;
      gtest_ar_.message_.ptr_._0_4_ = 0.0;
      gtest_ar_.message_.ptr_._4_4_ = 0.0;
      if (ts.set == false) {
        testing::Message::Message((Message *)&local_310);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&si,(internal *)&gtest_ar_,(AssertionResult *)"ts.has_value()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_338,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                   ,0xa7,(char *)si.optionalValue.__align);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_310)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
        std::__cxx11::string::~string((string *)&si);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_310);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pstd::optional<pbrt::ShapeSample>::~optional(&ts);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      local_358[0] = 0.0;
      local_358[1] = 0.0;
      local_37c = 0.0;
      for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
        FVar11 = pExp(&rng,8.0);
        pFVar6 = local_358;
        if ((iVar9 != 0) && (pFVar6 = local_358 + 1, iVar9 != 1)) {
          pFVar6 = &local_37c;
        }
        *pFVar6 = FVar11;
      }
      auVar16 = ZEXT856(0);
      local_348 = (float)local_358._0_8_;
      uStack_344 = SUB84(local_358._0_8_,4);
      uStack_340 = 0;
      uStack_33c = 0;
      local_34c = local_37c;
      this_00 = pstd::optional<pbrt::ShapeSample>::value(&ts);
      PVar17 = pbrt::Interaction::p(&this_00->intr);
      auVar14._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar16;
      auVar3._4_4_ = uStack_344;
      auVar3._0_4_ = local_348;
      auVar3._8_4_ = uStack_340;
      auVar3._12_4_ = uStack_33c;
      auVar2 = vsubps_avx(auVar14._0_16_,auVar3);
      local_310.d.super_Tuple3<pbrt::Vector3,_float>.z =
           PVar17.super_Tuple3<pbrt::Point3,_float>.z - local_34c;
      local_310.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3);
      local_310.o.super_Tuple3<pbrt::Point3,_float>.z = local_34c;
      local_310.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar2);
      local_310.time = 0.0;
      local_310.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      pbrt::ShapeHandle::Intersect(&si,&tri,&local_310,INFINITY);
      if (si.set != false) {
        pSVar7 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        local_348 = SUB84(pSVar7,0);
        uStack_344 = (undefined4)((ulong)pSVar7 >> 0x20);
        for (iVar9 = 0; iVar9 != 1000; iVar9 = iVar9 + 1) {
          u.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
          u.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
          fVar12 = pbrt::RNG::Uniform<float>(&rng);
          u.super_Tuple2<pbrt::Point2,_float>.x = fVar12;
          fVar12 = pbrt::RNG::Uniform<float>(&rng);
          u.super_Tuple2<pbrt::Point2,_float>.y = fVar12;
          auVar16 = extraout_var_00;
          VVar18 = pbrt::SampleUniformSphere(&u);
          local_2e0.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar15._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar15._8_56_ = auVar16;
          local_2e0._0_8_ = vmovlps_avx(auVar15._0_16_);
          pbrt::Interaction::SpawnRay
                    ((RayDifferential *)&gtest_ar_,(Interaction *)CONCAT44(uStack_344,local_348),
                     (Vector3f *)&local_2e0);
          local_338.o.super_Tuple3<pbrt::Point3,_float>._1_7_ = gtest_ar_._1_7_;
          local_338.o.super_Tuple3<pbrt::Point3,_float>.x._0_1_ = gtest_ar_.success_;
          local_338.o.super_Tuple3<pbrt::Point3,_float>.z = gtest_ar_.message_.ptr_._0_4_;
          local_338.d.super_Tuple3<pbrt::Vector3,_float>.x = gtest_ar_.message_.ptr_._4_4_;
          bVar4 = pbrt::ShapeHandle::IntersectP(&tri,&local_338,INFINITY);
          gtest_ar__1.success_ = !bVar4;
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar4) {
            testing::Message::Message((Message *)local_378);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"tri.IntersectP(rOut)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                       ,0xc0,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
            testing::internal::AssertHelper::operator=(&local_390,(Message *)local_378);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_378);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          pbrt::ShapeHandle::Intersect
                    ((optional<pbrt::ShapeIntersection> *)&gtest_ar_,&tri,&local_338,INFINITY);
          gtest_ar__1.success_ = (bool)(local_1b0 ^ 1);
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)&gtest_ar_);
          if (gtest_ar__1.success_ == false) {
            testing::Message::Message((Message *)local_378);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"tri.Intersect(rOut).has_value()","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                       ,0xc1,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
            testing::internal::AssertHelper::operator=(&local_390,(Message *)local_378);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_378);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          local_378._0_4_ = 0.0;
          local_378._4_4_ = 0.0;
          local_370._0_4_ = 0.0;
          for (iVar10 = 0; iVar10 != 3; iVar10 = iVar10 + 1) {
            FVar11 = pExp(&rng,8.0);
            pPVar8 = (Point3f *)local_378;
            if ((iVar10 != 0) && (pPVar8 = (Point3f *)(local_378 + 4), iVar10 != 1)) {
              pPVar8 = (Point3f *)local_370;
            }
            (pPVar8->super_Tuple3<pbrt::Point3,_float>).x = FVar11;
          }
          pbrt::Interaction::SpawnRayTo
                    ((Ray *)&gtest_ar_,(Interaction *)CONCAT44(uStack_344,local_348),
                     (Point3f *)local_378);
          local_338.o.super_Tuple3<pbrt::Point3,_float>._1_7_ = gtest_ar_._1_7_;
          local_338.o.super_Tuple3<pbrt::Point3,_float>.x._0_1_ = gtest_ar_.success_;
          local_338.o.super_Tuple3<pbrt::Point3,_float>.z = gtest_ar_.message_.ptr_._0_4_;
          local_338.d.super_Tuple3<pbrt::Vector3,_float>.x = gtest_ar_.message_.ptr_._4_4_;
          bVar4 = pbrt::ShapeHandle::IntersectP(&tri,&local_338,1.0);
          gtest_ar__1.success_ = !bVar4;
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar4) {
            testing::Message::Message((Message *)&local_390);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"tri.IntersectP(rOut, 1)","true","false",in_R9);
            pAVar1 = (AssertHelper *)(local_370 + 8);
            testing::internal::AssertHelper::AssertHelper
                      (pAVar1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                       ,0xc9,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
            testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_390);
            testing::internal::AssertHelper::~AssertHelper(pAVar1);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_390);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          pbrt::ShapeHandle::Intersect
                    ((optional<pbrt::ShapeIntersection> *)&gtest_ar_,&tri,&local_338,1.0);
          gtest_ar__1.success_ = (bool)(local_1b0 ^ 1);
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)&gtest_ar_);
          if (gtest_ar__1.success_ == false) {
            testing::Message::Message((Message *)&local_390);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"tri.Intersect(rOut, 1).has_value()","true","false",in_R9)
            ;
            pAVar1 = (AssertHelper *)(local_370 + 8);
            testing::internal::AssertHelper::AssertHelper
                      (pAVar1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                       ,0xca,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
            testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_390);
            testing::internal::AssertHelper::~AssertHelper(pAVar1);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_390);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
        }
      }
      pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
      pstd::optional<pbrt::ShapeSample>::~optional(&ts);
    }
    local_2e8 = local_2e8 + 1;
  } while( true );
}

Assistant:

TEST(Triangle, Reintersect) {
    for (int i = 0; i < 1000; ++i) {
        RNG rng(i);
        ShapeHandle tri = GetRandomTriangle([&]() { return pExp(rng); });
        if (!tri)
            continue;

        // Sample a point on the triangle surface to shoot the ray toward.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        auto ts = tri.Sample(u);
        ASSERT_TRUE(ts.has_value());

        // Choose a ray origin.
        Point3f o;
        for (int j = 0; j < 3; ++j)
            o[j] = pExp(rng);

        // Intersect the ray with the triangle.
        Ray r(o, ts->intr.p() - o);
        auto si = tri.Intersect(r);
        if (!si)
            // We should almost always find an intersection, but rarely
            // miss, due to round-off error. Just do another go-around in
            // this case.
            continue;
        SurfaceInteraction &isect = si->intr;

        // Now trace a bunch of rays leaving the intersection point.
        for (int j = 0; j < 1000; ++j) {
            // Random direction leaving the intersection point.
            Point2f u;
            u[0] = rng.Uniform<Float>();
            u[1] = rng.Uniform<Float>();
            Vector3f w = SampleUniformSphere(u);
            Ray rOut = isect.SpawnRay(w);
            EXPECT_FALSE(tri.IntersectP(rOut));
            EXPECT_FALSE(tri.Intersect(rOut).has_value());

            // Choose a random point to trace rays to.
            Point3f p2;
            for (int k = 0; k < 3; ++k)
                p2[k] = pExp(rng);
            rOut = isect.SpawnRayTo(p2);

            EXPECT_FALSE(tri.IntersectP(rOut, 1));
            EXPECT_FALSE(tri.Intersect(rOut, 1).has_value());
        }
    }
}